

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O0

void xercesc_4_0::XMLBigInteger::parseBigInteger
               (XMLCh *toConvert,XMLCh *retBuffer,int *signValue,MemoryManager *manager)

{
  bool bVar1;
  NumberFormatException *pNVar2;
  XMLSize_t XVar3;
  XMLCh *local_50;
  XMLCh *retPtr;
  XMLCh *endPtr;
  XMLCh *startPtr;
  MemoryManager *manager_local;
  int *signValue_local;
  XMLCh *retBuffer_local;
  XMLCh *toConvert_local;
  
  if ((toConvert == (XMLCh *)0x0) || (endPtr = toConvert, *toConvert == L'\0')) {
    pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
               ,0x68,XMLNUM_emptyString,manager);
    __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                NumberFormatException::~NumberFormatException);
  }
  while (bVar1 = XMLChar1_0::isWhitespace(*endPtr), bVar1) {
    endPtr = endPtr + 1;
  }
  if (*endPtr != L'\0') {
    XVar3 = XMLString::stringLen(toConvert);
    retPtr = toConvert + XVar3;
    while (bVar1 = XMLChar1_0::isWhitespace(retPtr[-1]), bVar1) {
      retPtr = retPtr + -1;
    }
    *signValue = 1;
    if (*endPtr == L'-') {
      *signValue = -1;
      endPtr = endPtr + 1;
      if (endPtr == retPtr) {
        pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (pNVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                   ,0x8d,XMLNUM_Inv_chars,manager);
        __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                    NumberFormatException::~NumberFormatException);
      }
    }
    else if ((*endPtr == L'+') && (endPtr = endPtr + 1, endPtr == retPtr)) {
      pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
      NumberFormatException::NumberFormatException
                (pNVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                 ,0x96,XMLNUM_Inv_chars,manager);
      __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                  NumberFormatException::~NumberFormatException);
    }
    for (; *endPtr == L'0'; endPtr = endPtr + 1) {
    }
    local_50 = retBuffer;
    if (endPtr < retPtr) {
      for (; endPtr < retPtr; endPtr = endPtr + 1) {
        if (((ushort)*endPtr < 0x30) || (0x39 < (ushort)*endPtr)) {
          pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (pNVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                     ,0xab,XMLNUM_Inv_chars,manager);
          __cxa_throw(pNVar2,&NumberFormatException::typeinfo,
                      NumberFormatException::~NumberFormatException);
        }
        *local_50 = *endPtr;
        local_50 = local_50 + 1;
      }
      *local_50 = L'\0';
    }
    else {
      *signValue = 0;
    }
    return;
  }
  pNVar2 = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (pNVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
             ,0x76,XMLNUM_WSString,manager);
  __cxa_throw(pNVar2,&NumberFormatException::typeinfo,NumberFormatException::~NumberFormatException)
  ;
}

Assistant:

void XMLBigInteger::parseBigInteger(const XMLCh* const toConvert
                                  , XMLCh* const retBuffer
                                  , int&   signValue
                                  , MemoryManager* const manager)
{
    // If no string, then its a failure
    if ((!toConvert) || (!*toConvert))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, manager);

    //
    // Note: in Java's BigInteger, it seems any leading and/or trailing
    // whitespaces are not allowed. If this is the case, we may
    // need to skip the trimming below.
    //

    // Scan past any whitespace. If we hit the end, then return failure
    const XMLCh* startPtr = toConvert;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Start at the end and work back through any whitespace
    const XMLCh* endPtr = toConvert + XMLString::stringLen(toConvert);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    //
    //  Work through what remains and convert each char to a digit.
    //  anything other than '
    //
    XMLCh* retPtr = retBuffer;
    signValue = 1;

    //
    // '+' or '-' is allowed only at the first position
    //
    if (*startPtr == chDash)
    {
        signValue = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        // skip the '+'
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }


    // Scan past any leading zero.
    while (*startPtr == chDigit_0)
        startPtr++;

    if (startPtr >= endPtr)
    {
        signValue = 0;
        // containning zero, only zero, nothing but zero
        // it is a zero, indeed
        return;
    }

    while (startPtr < endPtr)
    {
        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr = *startPtr;
        retPtr++;
        startPtr++;
    }

    *retPtr = 0;   //terminated
    return;
}